

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32_pclmulqdq_tpl.h
# Opt level: O0

void partial_fold(size_t len,__m128i *xmm_crc0,__m128i *xmm_crc1,__m128i *xmm_crc2,__m128i *xmm_crc3
                 ,__m128i *xmm_crc_part)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  ulong uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 (*pauVar12) [16];
  undefined1 (*in_RCX) [16];
  undefined1 (*in_RDX) [16];
  undefined1 (*in_RSI) [16];
  long in_RDI;
  undefined1 (*in_R8) [16];
  undefined1 (*in_R9) [16];
  __m128i xmm_tmp1;
  __m128i xmm_shr;
  __m128i xmm_shl;
  __m128i xmm_mask3;
  __m128i xmm_fold4;
  ulong local_368;
  ulong uStack_360;
  ulong local_358;
  ulong uStack_350;
  ulong local_278;
  ulong uStack_270;
  ulong local_1c8;
  ulong uStack_1c0;
  __m128 ps_res;
  __m128 psa0_1;
  __m128 psa0_0;
  __m128 ps_crc3;
  __m128i xmm_a0_1;
  __m128i xmm_a0_0;
  __m128i xmm_tmp3;
  __m128i xmm_tmp2;
  
  auVar1 = vpinsrd_avx(ZEXT416(0xc6e41596),1,1);
  auVar1 = vpinsrd_avx(auVar1,0x54442bd4,2);
  auVar1 = vpinsrd_avx(auVar1,1,3);
  local_278 = auVar1._0_8_;
  uStack_270 = auVar1._8_8_;
  auVar1 = vpinsrd_avx(ZEXT416(0x80808080),0x80808080,1);
  auVar1 = vpinsrd_avx(auVar1,0x80808080,2);
  auVar1 = vpinsrd_avx(auVar1,0x80808080,3);
  local_1c8 = auVar1._0_8_;
  uStack_1c0 = auVar1._8_8_;
  pauVar12 = (undefined1 (*) [16])(pshufb_shf_table + (in_RDI + -1) * 4);
  auVar5 = *pauVar12;
  auVar4 = *pauVar12;
  auVar7 = *pauVar12;
  auVar6 = *pauVar12;
  local_1c8 = *(ulong *)*pauVar12 ^ local_1c8;
  uStack_1c0 = *(ulong *)(pshufb_shf_table + (in_RDI + -1) * 4 + 2) ^ uStack_1c0;
  auVar2 = vpshufb_avx(*in_RSI,*pauVar12);
  auVar11._8_8_ = uStack_1c0;
  auVar11._0_8_ = local_1c8;
  auVar1 = vpshufb_avx(*in_RSI,auVar11);
  *in_RSI = auVar1;
  auVar1 = vpshufb_avx(*in_RDX,auVar6);
  auVar1 = vpor_avx(*in_RSI,auVar1);
  *in_RSI = auVar1;
  auVar10._8_8_ = uStack_1c0;
  auVar10._0_8_ = local_1c8;
  auVar1 = vpshufb_avx(*in_RDX,auVar10);
  *in_RDX = auVar1;
  auVar1 = vpshufb_avx(*in_RCX,auVar7);
  auVar1 = vpor_avx(*in_RDX,auVar1);
  *in_RDX = auVar1;
  auVar9._8_8_ = uStack_1c0;
  auVar9._0_8_ = local_1c8;
  auVar1 = vpshufb_avx(*in_RCX,auVar9);
  *in_RCX = auVar1;
  auVar1 = vpshufb_avx(*in_R8,auVar4);
  auVar1 = vpor_avx(*in_RCX,auVar1);
  *in_RCX = auVar1;
  auVar1._8_8_ = uStack_1c0;
  auVar1._0_8_ = local_1c8;
  auVar1 = vpshufb_avx(*in_R8,auVar1);
  *in_R8 = auVar1;
  auVar1 = vpshufb_avx(*in_R9,auVar5);
  *in_R9 = auVar1;
  auVar1 = vpor_avx(*in_R8,*in_R9);
  *in_R8 = auVar1;
  local_358 = auVar2._0_8_;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_358;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uStack_270;
  auVar1 = (undefined1  [16])0x0;
  for (uVar3 = 0; uVar3 < 0x40; uVar3 = uVar3 + 1) {
    if ((auVar6 & (undefined1  [16])0x1 << uVar3) != (undefined1  [16])0x0) {
      auVar1 = auVar1 ^ auVar7 << uVar3;
    }
  }
  uStack_350 = auVar2._8_8_;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uStack_350;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_278;
  auVar2 = (undefined1  [16])0x0;
  for (uVar3 = 0; uVar3 < 0x40; uVar3 = uVar3 + 1) {
    if ((auVar4 & (undefined1  [16])0x1 << uVar3) != (undefined1  [16])0x0) {
      auVar2 = auVar2 ^ auVar5 << uVar3;
    }
  }
  uVar8 = *(ulong *)(*in_R8 + 8);
  local_358 = auVar2._0_8_;
  uStack_350 = auVar2._8_8_;
  local_368 = auVar1._0_8_;
  uStack_360 = auVar1._8_8_;
  *(ulong *)*in_R8 = *(ulong *)*in_R8 ^ local_358 ^ local_368;
  *(ulong *)(*in_R8 + 8) = uVar8 ^ uStack_350 ^ uStack_360;
  return;
}

Assistant:

static void partial_fold(const size_t len, __m128i *xmm_crc0, __m128i *xmm_crc1, __m128i *xmm_crc2,
                         __m128i *xmm_crc3, __m128i *xmm_crc_part) {
    const __m128i xmm_fold4 = _mm_set_epi32( 0x00000001, 0x54442bd4,
                                             0x00000001, 0xc6e41596);
    const __m128i xmm_mask3 = _mm_set1_epi32((int32_t)0x80808080);

    __m128i xmm_shl, xmm_shr, xmm_tmp1, xmm_tmp2, xmm_tmp3;
    __m128i xmm_a0_0, xmm_a0_1;
    __m128 ps_crc3, psa0_0, psa0_1, ps_res;

    xmm_shl = _mm_load_si128((__m128i *)(pshufb_shf_table + (4 * (len - 1))));
    xmm_shr = xmm_shl;
    xmm_shr = _mm_xor_si128(xmm_shr, xmm_mask3);

    xmm_a0_0 = _mm_shuffle_epi8(*xmm_crc0, xmm_shl);

    *xmm_crc0 = _mm_shuffle_epi8(*xmm_crc0, xmm_shr);
    xmm_tmp1 = _mm_shuffle_epi8(*xmm_crc1, xmm_shl);
    *xmm_crc0 = _mm_or_si128(*xmm_crc0, xmm_tmp1);

    *xmm_crc1 = _mm_shuffle_epi8(*xmm_crc1, xmm_shr);
    xmm_tmp2 = _mm_shuffle_epi8(*xmm_crc2, xmm_shl);
    *xmm_crc1 = _mm_or_si128(*xmm_crc1, xmm_tmp2);

    *xmm_crc2 = _mm_shuffle_epi8(*xmm_crc2, xmm_shr);
    xmm_tmp3 = _mm_shuffle_epi8(*xmm_crc3, xmm_shl);
    *xmm_crc2 = _mm_or_si128(*xmm_crc2, xmm_tmp3);

    *xmm_crc3 = _mm_shuffle_epi8(*xmm_crc3, xmm_shr);
    *xmm_crc_part = _mm_shuffle_epi8(*xmm_crc_part, xmm_shl);
    *xmm_crc3 = _mm_or_si128(*xmm_crc3, *xmm_crc_part);

    xmm_a0_1 = _mm_clmulepi64_si128(xmm_a0_0, xmm_fold4, 0x10);
    xmm_a0_0 = _mm_clmulepi64_si128(xmm_a0_0, xmm_fold4, 0x01);

    ps_crc3 = _mm_castsi128_ps(*xmm_crc3);
    psa0_0 = _mm_castsi128_ps(xmm_a0_0);
    psa0_1 = _mm_castsi128_ps(xmm_a0_1);

    ps_res = _mm_xor_ps(ps_crc3, psa0_0);
    ps_res = _mm_xor_ps(ps_res, psa0_1);

    *xmm_crc3 = _mm_castps_si128(ps_res);
}